

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpixmapfilter.cpp
# Opt level: O0

void __thiscall
QPixmapConvolutionFilter::draw
          (QPixmapConvolutionFilter *this,QPainter *painter,QPointF *p,QPixmap *src,QRectF *srcRect)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  byte bVar3;
  bool bVar4;
  int iVar5;
  QPixmapConvolutionFilterPrivate *pQVar6;
  ulong uVar7;
  long *plVar8;
  void *pvVar9;
  QPointF *in_RDX;
  QPointF *in_RSI;
  long *in_RDI;
  QRectF *in_R8;
  long in_FS_OFFSET;
  qreal xpos;
  qreal ypos;
  QRasterPaintEngine *pe;
  QImage *target;
  QPixmapConvolutionFilterPrivate *d;
  QPoint offset_1;
  QImage result;
  QRect rect_1;
  QRect srect;
  QPointF offset;
  QRectF rect;
  QRectF clip;
  QTransform x_1;
  QTransform x;
  QTransform mat;
  undefined4 in_stack_fffffffffffffca8;
  undefined4 in_stack_fffffffffffffcac;
  undefined4 in_stack_fffffffffffffcb0;
  int iVar10;
  undefined4 in_stack_fffffffffffffcb4;
  QRect *in_stack_fffffffffffffcb8;
  QRectF *in_stack_fffffffffffffcc0;
  QRectF *in_stack_fffffffffffffcd8;
  long local_2f8;
  QPointF local_2b0 [2];
  qreal *in_stack_fffffffffffffd70;
  CompositionMode in_stack_fffffffffffffd7c;
  QRectF *in_stack_fffffffffffffd80;
  QImage *in_stack_fffffffffffffd88;
  QPointF *in_stack_fffffffffffffd90;
  QImage *in_stack_fffffffffffffd98;
  QSize local_240;
  undefined1 *local_238;
  undefined1 *local_230;
  undefined1 *local_228;
  undefined1 local_220 [32];
  undefined1 local_200 [32];
  undefined1 local_1e0 [16];
  undefined1 local_1d0 [16];
  QImage local_1c0 [24];
  QPointF local_1a8;
  QPointF local_198 [3];
  undefined1 local_168 [16];
  qreal local_158;
  qreal local_150;
  qreal local_148;
  qreal local_140;
  undefined8 local_138;
  undefined8 local_130;
  undefined8 local_128;
  undefined8 local_120;
  undefined8 local_118;
  undefined8 local_110;
  undefined8 local_108;
  undefined8 local_100;
  undefined1 local_f8 [8];
  int in_stack_ffffffffffffff10;
  int in_stack_ffffffffffffff18;
  QTransform local_a8;
  undefined1 local_58 [80];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar6 = d_func((QPixmapConvolutionFilter *)0x4ab080);
  uVar7 = QPainter::isActive();
  auVar2._8_8_ = local_168._8_8_;
  auVar2._0_8_ = local_168._0_8_;
  auVar1._8_8_ = local_168._8_8_;
  auVar1._0_8_ = local_168._0_8_;
  if ((((uVar7 & 1) != 0) && (local_168 = auVar1, 0 < pQVar6->kernelWidth)) &&
     (local_168 = auVar2, 0 < pQVar6->kernelHeight)) {
    uVar7 = QPixmap::isNull();
    if ((uVar7 & 1) == 0) {
      local_2f8 = 0;
      QPainter::paintEngine();
      plVar8 = (long *)QPaintEngine::paintDevice();
      iVar5 = (**(code **)(*plVar8 + 0x10))();
      if (iVar5 == 3) {
        QPainter::paintEngine();
        local_2f8 = QPaintEngine::paintDevice();
        memcpy(local_58,&DAT_00b0e6b0,0x50);
        QPainter::combinedTransform();
        iVar5 = QTransform::type();
        if (iVar5 < 2) {
          QPainter::paintEngine();
          iVar5 = QRasterPaintEngine::clipType();
          if (iVar5 == 1) {
            local_2f8 = 0;
          }
          else {
            local_118 = 0xffffffffffffffff;
            local_110 = 0xffffffffffffffff;
            local_108 = 0xffffffffffffffff;
            local_100 = 0xffffffffffffffff;
            QRasterPaintEngine::clipBoundingRect();
            local_138 = 0xffffffffffffffff;
            local_130 = 0xffffffffffffffff;
            local_128 = 0xffffffffffffffff;
            local_120 = 0xffffffffffffffff;
            bVar4 = QRectF::isEmpty(in_R8);
            if (bVar4) {
              local_168 = QPixmap::rect();
              QRectF::QRectF(in_stack_fffffffffffffcc0,in_stack_fffffffffffffcb8);
            }
            else {
              local_158 = in_R8->xp;
              local_150 = in_R8->yp;
              local_148 = in_R8->w;
              local_140 = in_R8->h;
            }
            (**(code **)(*in_RDI + 0x60))(&local_138,in_RDI,&local_158);
            memcpy(&local_a8,&DAT_00b0e700,0x50);
            pvVar9 = (void *)QPainter::deviceTransform();
            memcpy(&local_a8,pvVar9,0x50);
            QTransform::dx(&local_a8);
            QPointF::x(in_RDX);
            QTransform::dy(&local_a8);
            QPointF::y(in_RDX);
            QRectF::translated(in_stack_fffffffffffffcc0,(qreal)in_stack_fffffffffffffcb8,
                               (qreal)CONCAT44(in_stack_fffffffffffffcb4,in_stack_fffffffffffffcb0))
            ;
            bVar3 = QRectF::contains((QRectF *)&local_118);
            if (((bVar3 ^ 0xff) & 1) != 0) {
              local_2f8 = 0;
            }
          }
        }
        else {
          local_2f8 = 0;
        }
      }
      if (local_2f8 == 0) {
        local_1d0._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
        local_1d0._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
        bVar4 = QRectF::isNull(in_R8);
        if (bVar4) {
          local_1d0 = QPixmap::rect();
        }
        else {
          local_1d0 = (undefined1  [16])QRectF::toRect(in_stack_fffffffffffffcd8);
        }
        local_1e0._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
        local_1e0._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
        QRectF::QRectF(in_stack_fffffffffffffcc0,in_stack_fffffffffffffcb8);
        (**(code **)(*in_RDI + 0x60))(local_200,in_RDI,local_220);
        local_1e0 = (undefined1  [16])QRectF::toRect(in_stack_fffffffffffffcd8);
        local_238 = &DAT_aaaaaaaaaaaaaaaa;
        local_230 = &DAT_aaaaaaaaaaaaaaaa;
        local_228 = &DAT_aaaaaaaaaaaaaaaa;
        local_240 = QRect::size((QRect *)in_stack_fffffffffffffcc0);
        QImage::QImage((QImage *)&local_238,(QSize *)&local_240,Format_ARGB32_Premultiplied);
        QRect::topLeft((QRect *)CONCAT44(in_stack_fffffffffffffcac,in_stack_fffffffffffffca8));
        QRect::topLeft((QRect *)CONCAT44(in_stack_fffffffffffffcac,in_stack_fffffffffffffca8));
        ::operator-((QPoint *)in_stack_fffffffffffffcc0,(QPoint *)in_stack_fffffffffffffcb8);
        QPointF::QPointF((QPointF *)CONCAT44(in_stack_fffffffffffffcb4,in_stack_fffffffffffffcb0),
                         (QPoint *)CONCAT44(in_stack_fffffffffffffcac,in_stack_fffffffffffffca8));
        QPixmap::toImage();
        QRectF::QRectF(in_stack_fffffffffffffcc0,in_stack_fffffffffffffcb8);
        iVar5 = pQVar6->kernelWidth;
        iVar10 = pQVar6->kernelHeight;
        convolute(in_stack_fffffffffffffd98,in_stack_fffffffffffffd90,in_stack_fffffffffffffd88,
                  in_stack_fffffffffffffd80,in_stack_fffffffffffffd7c,in_stack_fffffffffffffd70,
                  in_stack_ffffffffffffff10,in_stack_ffffffffffffff18);
        QImage::~QImage((QImage *)&stack0xfffffffffffffd80);
        QPointF::QPointF((QPointF *)CONCAT44(in_stack_fffffffffffffcb4,iVar10),
                         (QPoint *)CONCAT44(in_stack_fffffffffffffcac,iVar5));
        local_2b0[0] = ::operator-((QPointF *)in_stack_fffffffffffffcb8,
                                   (QPointF *)CONCAT44(in_stack_fffffffffffffcb4,iVar10));
        QPainter::drawImage(in_RSI,(QImage *)local_2b0);
        QImage::~QImage((QImage *)&local_238);
      }
      else {
        memcpy(local_f8,&DAT_00b0e750,0x50);
        pvVar9 = (void *)QPainter::deviceTransform();
        memcpy(local_f8,pvVar9,0x50);
        local_198[0].xp = -NAN;
        local_198[0].yp = -NAN;
        xpos = QTransform::dx((QTransform *)local_f8);
        ypos = QTransform::dy((QTransform *)local_f8);
        QPointF::QPointF(local_198,xpos,ypos);
        local_1a8 = ::operator+((QPointF *)in_stack_fffffffffffffcb8,
                                (QPointF *)
                                CONCAT44(in_stack_fffffffffffffcb4,in_stack_fffffffffffffcb0));
        QPixmap::toImage();
        convolute(in_stack_fffffffffffffd98,in_stack_fffffffffffffd90,in_stack_fffffffffffffd88,
                  in_stack_fffffffffffffd80,in_stack_fffffffffffffd7c,in_stack_fffffffffffffd70,
                  in_stack_ffffffffffffff10,in_stack_ffffffffffffff18);
        QImage::~QImage(local_1c0);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QPixmapConvolutionFilter::draw(QPainter *painter, const QPointF &p, const QPixmap &src, const QRectF& srcRect) const
{
    Q_D(const QPixmapConvolutionFilter);
    if (!painter->isActive())
        return;

    if (d->kernelWidth<=0 || d->kernelHeight <= 0)
        return;

    if (src.isNull())
        return;

    // raster implementation

    QImage *target = nullptr;
    if (painter->paintEngine()->paintDevice()->devType() == QInternal::Image) {
        target = static_cast<QImage *>(painter->paintEngine()->paintDevice());

        QTransform mat = painter->combinedTransform();

        if (mat.type() > QTransform::TxTranslate) {
            // Disabled because of transformation...
            target = nullptr;
        } else {
            QRasterPaintEngine *pe = static_cast<QRasterPaintEngine *>(painter->paintEngine());
            if (pe->clipType() == QRasterPaintEngine::ComplexClip)
                // disabled because of complex clipping...
                target = nullptr;
            else {
                QRectF clip = pe->clipBoundingRect();
                QRectF rect = boundingRectFor(srcRect.isEmpty() ? src.rect() : srcRect);
                QTransform x = painter->deviceTransform();
                if (!clip.contains(rect.translated(x.dx() + p.x(), x.dy() + p.y()))) {
                    target = nullptr;
                }

            }
        }
    }

    if (target) {
        QTransform x = painter->deviceTransform();
        QPointF offset(x.dx(), x.dy());

        convolute(target, p+offset, src.toImage(), srcRect, QPainter::CompositionMode_SourceOver, d->convolutionKernel, d->kernelWidth, d->kernelHeight);
    } else {
        QRect srect = srcRect.isNull() ? src.rect() : srcRect.toRect();
        QRect rect = boundingRectFor(srect).toRect();
        QImage result = QImage(rect.size(), QImage::Format_ARGB32_Premultiplied);
        QPoint offset = srect.topLeft() - rect.topLeft();
        convolute(&result,
                  offset,
                  src.toImage(),
                  srect,
                  QPainter::CompositionMode_Source,
                  d->convolutionKernel,
                  d->kernelWidth,
                  d->kernelHeight);
        painter->drawImage(p - offset, result);
    }
}